

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,int i)

{
  Ch *buffer_00;
  char *pcVar1;
  char *end;
  char *buffer;
  int i_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  buffer_00 = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Push
                        (this->os_,0xb);
  pcVar1 = internal::i32toa(i,buffer_00);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Pop
            (this->os_,0xb - ((long)pcVar1 - (long)buffer_00));
  return true;
}

Assistant:

inline bool Writer<StringBuffer>::WriteInt(int i) {
    char *buffer = os_->Push(11);
    const char* end = internal::i32toa(i, buffer);
    os_->Pop(static_cast<size_t>(11 - (end - buffer)));
    return true;
}